

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdNewTarget<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  uchar uVar1;
  bool bVar2;
  CallFlags CVar3;
  Var value;
  JavascriptFunction *value_00;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *value_01;
  OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = CallInfo::HasNewTarget(*(CallFlags *)(this + 0x1c));
  if (bVar2) {
    uVar1 = playout->R0;
    value = CallInfo::GetNewTarget
                      (*(CallFlags *)(this + 0x1c),*(Var **)(this + 0x20),
                       *(uint *)(this + 0x18) & 0xffff);
    SetRegAllowStackVar<unsigned_char>(this,uVar1,value);
  }
  else {
    CVar3 = Js::operator&(*(CallFlags *)(this + 0x1c),CallFlags_New);
    if (CVar3 == CallFlags_None) {
      uVar1 = playout->R0;
      this_00 = GetScriptContext(this);
      this_01 = ScriptContext::GetLibrary(this_00);
      value_01 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
      SetReg<unsigned_char>(this,uVar1,value_01);
    }
    else {
      uVar1 = playout->R0;
      value_00 = GetFunctionExpression(this);
      SetRegAllowStackVar<unsigned_char>(this,uVar1,value_00);
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdNewTarget(const unaligned T* playout)
    {
        if (Js::CallInfo::HasNewTarget(this->m_callFlags))
        {
            SetRegAllowStackVar(playout->R0, (Js::RecyclableObject*)Js::CallInfo::GetNewTarget(this->m_callFlags, this->m_inParams, (ArgSlot)this->m_inSlotsCount));
        }
        else if (this->m_callFlags & CallFlags_New)
        {
            SetRegAllowStackVar(playout->R0, this->GetFunctionExpression());
        }
        else
        {
            SetReg(playout->R0, this->GetScriptContext()->GetLibrary()->GetUndefined());
        }
    }